

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall Memory::Recycler::CollectNow<(Memory::CollectionFlags)1073758208>(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CollectionState CVar4;
  undefined8 *in_FS_OFFSET;
  Recycler *this_local;
  
  BVar3 = IsAllocatableCallbackState(this);
  if (BVar3 == 0) {
    if (((this->disableCollection & 1U) == 0) && ((this->isShuttingDown & 1U) == 0)) {
      this_local._4_4_ = CollectInternal<(Memory::CollectionFlags)1073758208>(this);
    }
    else {
      CVar4 = ObservableValue::operator_cast_to_CollectionState
                        ((ObservableValue *)&this->collectionState);
      if (CVar4 != CollectionStateNotCollecting) {
        CVar4 = ObservableValue::operator_cast_to_CollectionState
                          ((ObservableValue *)&this->collectionState);
        if ((CVar4 != CollectionStateExit) && ((this->isShuttingDown & 1U) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0xe1a,
                             "(collectionState == CollectionStateNotCollecting || collectionState == CollectionStateExit || this->isShuttingDown)"
                             ,
                             "collectionState == CollectionStateNotCollecting || collectionState == CollectionStateExit || this->isShuttingDown"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
      }
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL
Recycler::CollectNow()
{
    // Force-in-thread cannot be concurrent or partial
    CompileAssert((flags & CollectOverride_ForceInThread) == 0 || (flags & (CollectMode_Concurrent | CollectMode_Partial)) == 0);

    // Collections not allowed when the recycler is currently executing the PostCollectionCallback
    if (this->IsAllocatableCallbackState())
    {
        return false;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if ((disableCollection && (flags & CollectOverride_Explicit) == 0) || isShuttingDown)
#else
    if (isShuttingDown)
#endif
    {
        Assert(collectionState == CollectionStateNotCollecting
            || collectionState == CollectionStateExit
            || this->isShuttingDown);
        return false;
    }

    if (flags & CollectOverride_ExhaustiveCandidate)
    {
        return CollectWithExhaustiveCandidate<flags>();
    }

    return CollectInternal<flags>();
}